

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

Item * __thiscall World::add_item(World *this,Item *item)

{
  size_type sVar1;
  mapped_type *ppIVar2;
  LandstalkerException *this_00;
  uint8_t local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_c0._M_dataplus._M_p._0_1_ = item->_id;
  sVar1 = std::
          map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
          ::count(&this->_items,(key_type_conflict *)&local_c0);
  if (sVar1 == 0) {
    local_c0._M_dataplus._M_p._0_1_ = item->_id;
    ppIVar2 = std::
              map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
              ::operator[](&this->_items,(key_type_conflict *)&local_c0);
    *ppIVar2 = item;
    return item;
  }
  this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string(&local_a0,(uint)item->_id);
  std::operator+(&local_80,"Cannot add item #",&local_a0);
  std::operator+(&local_60,&local_80," since there is already one with the same ID (");
  local_c1 = item->_id;
  ppIVar2 = std::
            map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
            ::operator[](&this->_items,&local_c1);
  std::operator+(&local_40,&local_60,&(*ppIVar2)->_name);
  std::operator+(&local_c0,&local_40,")");
  LandstalkerException::LandstalkerException(this_00,&local_c0);
  __cxa_throw(this_00,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException);
}

Assistant:

Item* World::add_item(Item* item)
{
    if(_items.count(item->id()))
        throw LandstalkerException("Cannot add item #" + std::to_string(item->id()) + " since there is already one with the same ID (" + _items[item->id()]->name() + ")");

    _items[item->id()] = item;
    return item;
}